

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deblock.c
# Opt level: O3

void com_deblock_set_edge(com_core_t *core)

{
  com_map_t *map;
  com_ref_pic_t (*refp) [2];
  s8 asVar1 [2];
  s8 asVar2 [2];
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  com_seqh_t *pcVar7;
  s8 *psVar8;
  u8 *puVar9;
  s8 (*pasVar10) [2];
  s16 (*paasVar11) [2] [2];
  long lVar12;
  int scu_x;
  int scu_y;
  byte *pbVar13;
  ushort uVar14;
  com_pic_t *pcVar15;
  long lVar16;
  byte bVar17;
  ushort uVar18;
  int iVar19;
  com_pic_t *pcVar20;
  uint uVar21;
  int iVar22;
  int iVar23;
  long lVar24;
  int iVar25;
  com_pic_t *pcVar26;
  long lVar27;
  com_pic_t *pcVar28;
  int cuw;
  int cuh;
  int in_stack_ffffffffffffff78;
  com_pic_t *local_68;
  com_pic_t *local_58;
  
  pcVar7 = core->seqhdr;
  psVar8 = (core->map).map_patch;
  iVar19 = pcVar7->i_scu;
  lVar16 = (long)iVar19;
  lVar12 = (long)core->cu_scup;
  lVar27 = (long)core->lcu_x + (long)pcVar7->pic_width_in_lcu * (long)core->lcu_y;
  uVar3 = core->cu_width;
  cuw = (int)uVar3 >> 2;
  uVar4 = core->cu_height;
  cuh = (int)uVar4 >> 2;
  uVar5 = core->cu_pix_x;
  scu_x = (int)uVar5 >> 2;
  uVar6 = core->cu_pix_y;
  scu_y = (int)uVar6 >> 2;
  iVar25 = (int)uVar4 >> 0x1f;
  iVar23 = (int)uVar3 >> 0x1f;
  if (((byte)(core->map).map_scu[lVar12] & 0x12) != 0) {
    puVar9 = (core->map).map_edge;
    iVar22 = core->tb_part;
    if (iVar22 == 5) {
      uVar21 = (cuh - iVar25 >> 1) + scu_y;
      if (3 < uVar3 && (uVar21 & 1) == 0) {
        lVar24 = 0;
        do {
          puVar9[lVar24 + (int)(uVar21 * iVar19 + scu_x)] =
               puVar9[lVar24 + (int)(uVar21 * iVar19 + scu_x)] | 4;
          lVar24 = lVar24 + 1;
        } while (cuw != (int)lVar24);
      }
      uVar21 = scu_x + (cuw - iVar23 >> 1);
      if (3 < uVar4 && (uVar21 & 1) == 0) {
        pbVar13 = puVar9 + (int)(scu_y * iVar19 + uVar21);
        iVar19 = cuh;
        do {
          *pbVar13 = *pbVar13 | 1;
          pbVar13 = pbVar13 + lVar16;
          iVar19 = iVar19 + -1;
        } while (iVar19 != 0);
      }
    }
    else if (iVar22 == 7) {
      iVar25 = cuw + 3;
      if (-1 < cuw) {
        iVar25 = cuw;
      }
      uVar21 = scu_x + (iVar25 >> 2);
      if (3 < uVar4 && (uVar21 & 1) == 0) {
        pbVar13 = puVar9 + (int)(scu_y * iVar19 + uVar21);
        iVar22 = cuh;
        do {
          *pbVar13 = *pbVar13 | 1;
          pbVar13 = pbVar13 + lVar16;
          iVar22 = iVar22 + -1;
        } while (iVar22 != 0);
      }
      uVar21 = (cuw - iVar23 >> 1) + scu_x;
      if (3 < uVar4 && (uVar21 & 1) == 0) {
        pbVar13 = puVar9 + (int)(scu_y * iVar19 + uVar21);
        iVar23 = cuh;
        do {
          *pbVar13 = *pbVar13 | 1;
          pbVar13 = pbVar13 + lVar16;
          iVar23 = iVar23 + -1;
        } while (iVar23 != 0);
      }
      uVar21 = scu_x + (iVar25 >> 2) * 3;
      if (3 < uVar4 && (uVar21 & 1) == 0) {
        pbVar13 = puVar9 + (int)(scu_y * iVar19 + uVar21);
        iVar19 = cuh;
        do {
          *pbVar13 = *pbVar13 | 1;
          pbVar13 = pbVar13 + lVar16;
          iVar19 = iVar19 + -1;
        } while (iVar19 != 0);
      }
    }
    else if (iVar22 == 6) {
      iVar23 = cuh + 3;
      if (-1 < cuh) {
        iVar23 = cuh;
      }
      uVar21 = scu_y + (iVar23 >> 2);
      if (3 < uVar3 && (uVar21 & 1) == 0) {
        lVar24 = 0;
        do {
          puVar9[lVar24 + (int)(uVar21 * iVar19 + scu_x)] =
               puVar9[lVar24 + (int)(uVar21 * iVar19 + scu_x)] | 4;
          lVar24 = lVar24 + 1;
        } while (cuw != (int)lVar24);
      }
      uVar21 = (cuh - iVar25 >> 1) + scu_y;
      if (3 < uVar3 && (uVar21 & 1) == 0) {
        lVar24 = 0;
        do {
          puVar9[lVar24 + (int)(uVar21 * iVar19 + scu_x)] =
               puVar9[lVar24 + (int)(uVar21 * iVar19 + scu_x)] | 4;
          lVar24 = lVar24 + 1;
        } while (cuw != (int)lVar24);
      }
      uVar21 = scu_y + (iVar23 >> 2) * 3;
      if (3 < uVar3 && (uVar21 & 1) == 0) {
        lVar24 = 0;
        do {
          puVar9[lVar24 + (int)(uVar21 * iVar19 + scu_x)] =
               puVar9[lVar24 + (int)(uVar21 * iVar19 + scu_x)] | 4;
          lVar24 = lVar24 + 1;
        } while (cuw != (int)lVar24);
      }
    }
    if ((char)((uVar6 & 4) >> 2) == '\0' && 3 < uVar6) {
      if ((core->cu_pix_y == core->lcu_pix_y) && (pcVar7->cross_patch_loop_filter == '\0')) {
        if (uVar3 < 4 ||
            psVar8[lVar27] != psVar8[(long)(int)lVar27 - (long)pcVar7->pic_width_in_lcu])
        goto LAB_00113db2;
      }
      else if (uVar3 < 4) goto LAB_00113db2;
      lVar24 = 0;
      do {
        puVar9[lVar24 + lVar12] = puVar9[lVar24 + lVar12] | 0xc;
        lVar24 = lVar24 + 1;
      } while (cuw != (int)lVar24);
    }
LAB_00113db2:
    if ((char)((uVar5 & 4) >> 2) != '\0' || uVar5 < 4) {
      return;
    }
    if ((core->cu_pix_x == core->lcu_pix_x) && (pcVar7->cross_patch_loop_filter == '\0')) {
      if (uVar4 < 4 || psVar8[lVar27] != psVar8[lVar27 + -1]) {
        return;
      }
    }
    else if (uVar4 < 4) {
      return;
    }
    pbVar13 = puVar9 + lVar12;
    do {
      *pbVar13 = *pbVar13 | 3;
      pbVar13 = pbVar13 + lVar16;
      cuh = cuh + -1;
    } while (cuh != 0);
    return;
  }
  map = &core->map;
  refp = core->refp;
  iVar22 = core->tb_part;
  if (iVar22 == 5) {
    uVar21 = (cuh - iVar25 >> 1) + scu_y;
    if ((uVar21 & 1) == 0) {
      com_df_set_edge_hor(map,iVar19,refp,scu_x,uVar21,cuw,in_stack_ffffffffffffff78);
    }
    iVar25 = cuw - iVar23 >> 1;
  }
  else {
    if (iVar22 != 7) {
      if (iVar22 == 6) {
        iVar23 = cuh + 3;
        if (-1 < cuh) {
          iVar23 = cuh;
        }
        uVar21 = scu_y + (iVar23 >> 2);
        if ((uVar21 & 1) == 0) {
          com_df_set_edge_hor(map,iVar19,refp,scu_x,uVar21,cuw,in_stack_ffffffffffffff78);
        }
        uVar21 = (cuh - iVar25 >> 1) + scu_y;
        if ((uVar21 & 1) == 0) {
          com_df_set_edge_hor(map,iVar19,refp,scu_x,uVar21,cuw,in_stack_ffffffffffffff78);
        }
        uVar21 = (iVar23 >> 2) * 3 + scu_y;
        if ((uVar21 & 1) == 0) {
          com_df_set_edge_hor(map,iVar19,refp,scu_x,uVar21,cuw,in_stack_ffffffffffffff78);
        }
      }
      goto LAB_00113eea;
    }
    iVar25 = cuw + 3;
    if (-1 < cuw) {
      iVar25 = cuw;
    }
    uVar21 = scu_x + (iVar25 >> 2);
    if ((uVar21 & 1) == 0) {
      com_df_set_edge_ver(map,iVar19,refp,uVar21,scu_y,cuh,in_stack_ffffffffffffff78);
    }
    uVar21 = (cuw - iVar23 >> 1) + scu_x;
    if ((uVar21 & 1) == 0) {
      com_df_set_edge_ver(map,iVar19,refp,uVar21,scu_y,cuh,in_stack_ffffffffffffff78);
    }
    iVar25 = (iVar25 >> 2) * 3;
  }
  if ((iVar25 + scu_x & 1U) == 0) {
    com_df_set_edge_ver(map,iVar19,refp,iVar25 + scu_x,scu_y,cuh,in_stack_ffffffffffffff78);
  }
LAB_00113eea:
  if (((char)((uVar6 & 4) >> 2) == '\0' && 3 < uVar6) &&
     (((core->cu_pix_y != core->lcu_pix_y || (pcVar7->cross_patch_loop_filter != '\0')) ||
      (psVar8[lVar27] == psVar8[(long)(int)lVar27 - (long)pcVar7->pic_width_in_lcu])))) {
    pasVar10 = (core->map).map_refi;
    lVar12 = (long)(scu_y * iVar19 + scu_x);
    if ((long)pasVar10[lVar12][0] < 0) {
      local_68 = (com_pic_t *)0x0;
    }
    else {
      local_68 = refp[pasVar10[lVar12][0]][0].pic;
    }
    if ((long)pasVar10[lVar12][1] < 0) {
      local_58 = (com_pic_t *)0x0;
    }
    else {
      local_58 = core->refp[pasVar10[lVar12][1]][1].pic;
    }
    if (3 < uVar3) {
      puVar9 = (core->map).map_edge;
      iVar25 = (scu_y + -1) * iVar19 + scu_x;
      lVar24 = lVar12;
      do {
        if (((byte)(core->map).map_scu[iVar25] & 0x12) == 0) {
          asVar1 = pasVar10[lVar12];
          asVar2 = (core->map).map_refi[iVar25];
          if (asVar1 != asVar2) {
            if (asVar2[0] < '\0') {
              pcVar15 = (com_pic_t *)0x0;
            }
            else {
              pcVar15 = *(com_pic_t **)
                         ((long)&(*refp)[0].pic + (ulong)(((ushort)asVar2 & 0x7f) << 6));
            }
            if ((short)asVar2 < 0) {
              pcVar20 = (com_pic_t *)0x0;
            }
            else {
              pcVar20 = core->refp[(ushort)asVar2 >> 8][1].pic;
            }
            if ((pcVar20 == local_68) && (pcVar15 == local_58)) {
              paasVar11 = (core->map).map_mv;
              if (asVar1[0] < '\0') {
LAB_001141c4:
                if (-1 < (short)asVar1) {
                  iVar23 = (int)paasVar11[lVar24][1][0] - (int)paasVar11[iVar25][0][0];
                  uVar18 = (ushort)iVar23;
                  uVar14 = -uVar18;
                  if (0 < iVar23) {
                    uVar14 = uVar18;
                  }
                  if (3 < uVar14) goto LAB_00114068;
                  iVar22 = (int)paasVar11[lVar24][1][1] - (int)paasVar11[iVar25][0][1];
                  iVar23 = -iVar22;
                  if (0 < iVar22) {
                    iVar23 = iVar22;
                  }
                  uVar18 = (ushort)iVar23;
                  goto joined_r0x00114202;
                }
                goto LAB_00114208;
              }
              iVar23 = (int)paasVar11[lVar24][0][0] - (int)paasVar11[iVar25][1][0];
              uVar18 = (ushort)iVar23;
              uVar14 = -uVar18;
              if (0 < iVar23) {
                uVar14 = uVar18;
              }
              if (uVar14 < 4) {
                iVar22 = (int)paasVar11[lVar24][0][1] - (int)paasVar11[iVar25][1][1];
                iVar23 = -iVar22;
                if (0 < iVar22) {
                  iVar23 = iVar22;
                }
                if ((ushort)iVar23 < 4) goto LAB_001141c4;
              }
            }
            goto LAB_00114068;
          }
          paasVar11 = (core->map).map_mv;
          if (-1 < asVar1[0]) {
            iVar23 = (int)paasVar11[lVar24][0][0] - (int)paasVar11[iVar25][0][0];
            uVar18 = (ushort)iVar23;
            uVar14 = -uVar18;
            if (0 < iVar23) {
              uVar14 = uVar18;
            }
            if (uVar14 < 4) {
              iVar22 = (int)paasVar11[lVar24][0][1] - (int)paasVar11[iVar25][0][1];
              iVar23 = -iVar22;
              if (0 < iVar22) {
                iVar23 = iVar22;
              }
              if ((ushort)iVar23 < 4) goto LAB_001140df;
            }
            goto LAB_00114068;
          }
LAB_001140df:
          if (-1 < (short)asVar1) {
            iVar23 = (int)paasVar11[lVar24][1][0] - (int)paasVar11[iVar25][1][0];
            uVar18 = (ushort)iVar23;
            uVar14 = -uVar18;
            if (0 < iVar23) {
              uVar14 = uVar18;
            }
            if (uVar14 < 4) {
              iVar22 = (int)paasVar11[lVar24][1][1] - (int)paasVar11[iVar25][1][1];
              iVar23 = -iVar22;
              if (0 < iVar22) {
                iVar23 = iVar22;
              }
              uVar18 = (ushort)iVar23;
joined_r0x00114202:
              if (uVar18 < 4) goto LAB_00114208;
            }
            goto LAB_00114068;
          }
LAB_00114208:
          bVar17 = 0;
        }
        else {
LAB_00114068:
          bVar17 = 0xc;
        }
        pbVar13 = puVar9 + lVar24;
        *pbVar13 = *pbVar13 | bVar17;
        cuw = cuw + -1;
        iVar25 = iVar25 + 1;
        lVar24 = lVar24 + 1;
      } while (cuw != 0);
    }
  }
  if (((char)((uVar5 & 4) >> 2) == '\0' && 3 < uVar5) &&
     (((core->cu_pix_x != core->lcu_pix_x || (pcVar7->cross_patch_loop_filter != '\0')) ||
      (psVar8[lVar27] == psVar8[lVar27 + -1])))) {
    pasVar10 = (core->map).map_refi;
    lVar12 = (long)(scu_y * iVar19 + scu_x);
    if ((long)pasVar10[lVar12][0] < 0) {
      pcVar15 = (com_pic_t *)0x0;
    }
    else {
      pcVar15 = refp[pasVar10[lVar12][0]][0].pic;
    }
    if ((long)pasVar10[lVar12][1] < 0) {
      pcVar20 = (com_pic_t *)0x0;
    }
    else {
      pcVar20 = core->refp[pasVar10[lVar12][1]][1].pic;
    }
    if (3 < uVar4) {
      puVar9 = (core->map).map_edge;
      lVar27 = lVar12;
      do {
        if (((byte)(core->map).map_scu[lVar27 + -1] & 0x12) == 0) {
          asVar1 = pasVar10[lVar12];
          asVar2 = (core->map).map_refi[lVar27 + -1];
          if (asVar1 != asVar2) {
            if (asVar2[0] < '\0') {
              pcVar28 = (com_pic_t *)0x0;
            }
            else {
              pcVar28 = *(com_pic_t **)
                         ((long)&(*refp)[0].pic + (ulong)(((ushort)asVar2 & 0x7f) << 6));
            }
            if ((short)asVar2 < 0) {
              pcVar26 = (com_pic_t *)0x0;
            }
            else {
              pcVar26 = core->refp[(ushort)asVar2 >> 8][1].pic;
            }
            if ((pcVar26 == pcVar15) && (pcVar28 == pcVar20)) {
              paasVar11 = (core->map).map_mv;
              if (asVar1[0] < '\0') {
LAB_001143bd:
                if (-1 < (short)asVar1) {
                  iVar25 = (int)paasVar11[lVar27][1][0] - (int)paasVar11[lVar27 + -1][0][0];
                  iVar19 = -iVar25;
                  if (0 < iVar25) {
                    iVar19 = iVar25;
                  }
                  if (3 < (ushort)iVar19) goto LAB_00114250;
                  iVar19 = (int)paasVar11[lVar27][1][1] - (int)paasVar11[lVar27 + -1][0][1];
                  uVar18 = (ushort)iVar19;
                  uVar14 = -uVar18;
                  if (0 < iVar19) {
                    uVar14 = uVar18;
                  }
                  goto joined_r0x00114405;
                }
                goto LAB_0011440b;
              }
              iVar19 = (int)paasVar11[lVar27][0][0] - (int)paasVar11[lVar27 + -1][1][0];
              uVar18 = (ushort)iVar19;
              uVar14 = -uVar18;
              if (0 < iVar19) {
                uVar14 = uVar18;
              }
              if (uVar14 < 4) {
                iVar19 = (int)paasVar11[lVar27][0][1] - (int)paasVar11[lVar27 + -1][1][1];
                uVar18 = (ushort)iVar19;
                uVar14 = -uVar18;
                if (0 < iVar19) {
                  uVar14 = uVar18;
                }
                if (uVar14 < 4) goto LAB_001143bd;
              }
            }
            goto LAB_00114250;
          }
          paasVar11 = (core->map).map_mv;
          if (-1 < asVar1[0]) {
            iVar19 = (int)paasVar11[lVar27][0][0] - (int)paasVar11[lVar27 + -1][0][0];
            uVar18 = (ushort)iVar19;
            uVar14 = -uVar18;
            if (0 < iVar19) {
              uVar14 = uVar18;
            }
            if (uVar14 < 4) {
              iVar19 = (int)paasVar11[lVar27][0][1] - (int)paasVar11[lVar27 + -1][0][1];
              uVar18 = (ushort)iVar19;
              uVar14 = -uVar18;
              if (0 < iVar19) {
                uVar14 = uVar18;
              }
              if (uVar14 < 4) goto LAB_001142ca;
            }
            goto LAB_00114250;
          }
LAB_001142ca:
          if (-1 < (short)asVar1) {
            iVar25 = (int)paasVar11[lVar27][1][0] - (int)paasVar11[lVar27 + -1][1][0];
            iVar19 = -iVar25;
            if (0 < iVar25) {
              iVar19 = iVar25;
            }
            if ((ushort)iVar19 < 4) {
              iVar19 = (int)paasVar11[lVar27][1][1] - (int)paasVar11[lVar27 + -1][1][1];
              uVar18 = (ushort)iVar19;
              uVar14 = -uVar18;
              if (0 < iVar19) {
                uVar14 = uVar18;
              }
joined_r0x00114405:
              if (uVar14 < 4) goto LAB_0011440b;
            }
            goto LAB_00114250;
          }
LAB_0011440b:
          bVar17 = 0;
        }
        else {
LAB_00114250:
          bVar17 = 3;
        }
        pbVar13 = puVar9 + lVar27;
        *pbVar13 = *pbVar13 | bVar17;
        cuh = cuh + -1;
        lVar27 = lVar27 + lVar16;
      } while (cuh != 0);
    }
  }
  return;
}

Assistant:

void com_deblock_set_edge(com_core_t *core)
{
    com_seqh_t *seqhdr = core->seqhdr;
    com_map_t *map = &core->map;
    s8 *patch_idx = map->map_patch;
    int i_scu = seqhdr->i_scu;
    int scup = core->cu_scup;
    int lcu_idx = core->lcu_y * seqhdr->pic_width_in_lcu + core->lcu_x;
    int scu_w = core->cu_width  >> MIN_CU_LOG2;
    int scu_h = core->cu_height >> MIN_CU_LOG2;
    int scu_x = core->cu_pix_x  >> MIN_CU_LOG2;
    int scu_y = core->cu_pix_y  >> MIN_CU_LOG2;
    const int grad_mask = (LOOPFILTER_GRID >> 2) - 1;
    const com_scu_t mask = { 0, 1, 0, 0, 1, 0, 0 };
    com_scu_t scu = map->map_scu[scup];

    if ((*(u8*)&scu) & (*(u8*)&mask)) {
        u8 *edge = map->map_edge;

        switch (core->tb_part) {
        case SIZE_2NxhN:
            com_df_set_edge_hor_force(edge, i_scu, scu_x, scu_y + scu_h / 4 * 1, scu_w, EDGE_TYPE_LUMA);
            com_df_set_edge_hor_force(edge, i_scu, scu_x, scu_y + scu_h / 2    , scu_w, EDGE_TYPE_LUMA);
            com_df_set_edge_hor_force(edge, i_scu, scu_x, scu_y + scu_h / 4 * 3, scu_w, EDGE_TYPE_LUMA);
            break;                    
        case SIZE_hNx2N:              
            com_df_set_edge_ver_force(edge, i_scu, scu_x + scu_w / 4 * 1, scu_y, scu_h, EDGE_TYPE_LUMA);
            com_df_set_edge_ver_force(edge, i_scu, scu_x + scu_w / 2    , scu_y, scu_h, EDGE_TYPE_LUMA);
            com_df_set_edge_ver_force(edge, i_scu, scu_x + scu_w / 4 * 3, scu_y, scu_h, EDGE_TYPE_LUMA);
            break;                    
        case SIZE_NxN:                
            com_df_set_edge_hor_force(edge, i_scu, scu_x, scu_y + scu_h / 2, scu_w, EDGE_TYPE_LUMA);
            com_df_set_edge_ver_force(edge, i_scu, scu_x + scu_w / 2, scu_y, scu_h, EDGE_TYPE_LUMA);
            break;
        default:
            break;
        }
        if (scu_y && (scu_y & grad_mask) == 0 && (core->cu_pix_y != core->lcu_pix_y || seqhdr->cross_patch_loop_filter || patch_idx[lcu_idx] == patch_idx[lcu_idx - seqhdr->pic_width_in_lcu])) {
            com_df_set_edge_hor_force_cu(edge + scup, i_scu, scu_w, EDGE_TYPE_ALL);  // UP
        }
        if (scu_x && (scu_x & grad_mask) == 0 && (core->cu_pix_x != core->lcu_pix_x || seqhdr->cross_patch_loop_filter || patch_idx[lcu_idx] == patch_idx[lcu_idx - 1])) {
            com_df_set_edge_ver_force_cu(edge + scup, i_scu, scu_h, EDGE_TYPE_ALL);  // LEFT
        }

    } else {
        com_ref_pic_t(*refp)[REFP_NUM] = core->refp;

#define set_edge_hor(map, i_scu, refp, scu_x, scu_y, cu_w, flag) { if (((scu_y) & grad_mask) == 0)  com_df_set_edge_hor(map, i_scu, refp, scu_x, scu_y, cu_w, flag); }
#define set_edge_ver(map, i_scu, refp, scu_x, scu_y, cu_w, flag) { if (((scu_x) & grad_mask) == 0)  com_df_set_edge_ver(map, i_scu, refp, scu_x, scu_y, cu_w, flag); }
        
        switch (core->tb_part) {
        case SIZE_2NxhN:
            set_edge_hor(map, i_scu, refp, scu_x, scu_y + scu_h / 4 * 1, scu_w, EDGE_TYPE_LUMA);
            set_edge_hor(map, i_scu, refp, scu_x, scu_y + scu_h / 2    , scu_w, EDGE_TYPE_LUMA);
            set_edge_hor(map, i_scu, refp, scu_x, scu_y + scu_h / 4 * 3, scu_w, EDGE_TYPE_LUMA);
            break;
        case SIZE_hNx2N:
            set_edge_ver(map, i_scu, refp, scu_x + scu_w / 4 * 1, scu_y, scu_h, EDGE_TYPE_LUMA);
            set_edge_ver(map, i_scu, refp, scu_x + scu_w / 2    , scu_y, scu_h, EDGE_TYPE_LUMA);
            set_edge_ver(map, i_scu, refp, scu_x + scu_w / 4 * 3, scu_y, scu_h, EDGE_TYPE_LUMA);
            break;
        case SIZE_NxN:
            set_edge_hor(map, i_scu, refp, scu_x, scu_y + scu_h / 2, scu_w, EDGE_TYPE_LUMA);
            set_edge_ver(map, i_scu, refp, scu_x + scu_w / 2, scu_y, scu_h, EDGE_TYPE_LUMA);
            break;
        default:
            break;
        }
        
        if (scu_y && (scu_y & grad_mask) == 0 && (core->cu_pix_y != core->lcu_pix_y || seqhdr->cross_patch_loop_filter || patch_idx[lcu_idx] == patch_idx[lcu_idx - seqhdr->pic_width_in_lcu])) {
            com_df_set_edge_hor_inline(map, i_scu, refp, scu_x, scu_y, scu_w, EDGE_TYPE_ALL);  // UP
        }
        if (scu_x && (scu_x & grad_mask) == 0 && (core->cu_pix_x != core->lcu_pix_x || seqhdr->cross_patch_loop_filter || patch_idx[lcu_idx] == patch_idx[lcu_idx - 1])) {
            com_df_set_edge_ver_inline(map, i_scu, refp, scu_x, scu_y, scu_h, EDGE_TYPE_ALL);  // LEFT
        }
    }
}